

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O0

void __thiscall QPainterPathStroker::QPainterPathStroker(QPainterPathStroker *this,QPen *pen)

{
  long lVar1;
  PenStyle PVar2;
  QPainterPathStrokerPrivate *this_00;
  QPainterPathStroker *in_RSI;
  QList<double> *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffb8;
  PenCapStyle in_stack_ffffffffffffffbc;
  PenStyle style;
  QList<double> *dashPattern;
  QPainterPathStroker *in_stack_ffffffffffffffe0;
  QPen *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  dashPattern = in_RDI;
  this_00 = (QPainterPathStrokerPrivate *)operator_new(0xd0);
  QPainterPathStrokerPrivate::QPainterPathStrokerPrivate(this_00);
  QScopedPointer<QPainterPathStrokerPrivate,_QScopedPointerDeleter<QPainterPathStrokerPrivate>_>::
  QScopedPointer((QScopedPointer<QPainterPathStrokerPrivate,_QScopedPointerDeleter<QPainterPathStrokerPrivate>_>
                  *)in_RDI,this_00);
  style = (PenStyle)((ulong)in_RDI >> 0x20);
  QPen::widthF((QPen *)0x5bd0ba);
  setWidth((QPainterPathStroker *)this_00,
           (qreal)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  QPen::capStyle((QPen *)0x5bd0ce);
  setCapStyle((QPainterPathStroker *)this_00,in_stack_ffffffffffffffbc);
  QPen::joinStyle((QPen *)0x5bd0e4);
  setJoinStyle((QPainterPathStroker *)this_00,in_stack_ffffffffffffffbc);
  QPen::miterLimit((QPen *)0x5bd0fa);
  setMiterLimit((QPainterPathStroker *)this_00,
                (qreal)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  QPen::dashOffset((QPen *)0x5bd10e);
  setDashOffset((QPainterPathStroker *)this_00,
                (qreal)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  PVar2 = QPen::style((QPen *)0x5bd122);
  if (PVar2 == CustomDashLine) {
    QPen::dashPattern(in_stack_ffffffffffffffe8);
    setDashPattern(in_stack_ffffffffffffffe0,dashPattern);
    QList<double>::~QList((QList<double> *)0x5bd14f);
  }
  else {
    QPen::style((QPen *)0x5bd15b);
    setDashPattern(in_RSI,style);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QPainterPathStroker::QPainterPathStroker(const QPen &pen)
    : d_ptr(new QPainterPathStrokerPrivate)
{
    setWidth(pen.widthF());
    setCapStyle(pen.capStyle());
    setJoinStyle(pen.joinStyle());
    setMiterLimit(pen.miterLimit());
    setDashOffset(pen.dashOffset());

    if (pen.style() == Qt::CustomDashLine)
        setDashPattern(pen.dashPattern());
    else
        setDashPattern(pen.style());
}